

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_socket.c
# Opt level: O3

ares_status_t
ares_socket_configure(ares_channel_t *channel,int family,ares_bool_t is_tcp,ares_socket_t fd)

{
  char *str;
  uint uVar1;
  _func_int_ares_socket_t_ares_socket_opt_t_void_ptr_ares_socklen_t_void_ptr *p_Var2;
  _func_int_ares_socket_t_uint_sockaddr_ptr_socklen_t_void_ptr *p_Var3;
  int iVar4;
  int *piVar5;
  size_t sVar6;
  socklen_t sVar7;
  undefined1 auVar8 [16];
  anon_union_28_3_cd40b0ee local;
  sockaddr local_58;
  undefined8 uStack_48;
  undefined4 uStack_40;
  
  if (((0 < channel->socket_send_buffer_size) &&
      (iVar4 = (*(channel->sock_funcs).asetsockopt)
                         (fd,ARES_SOCKET_OPT_SENDBUF_SIZE,&channel->socket_send_buffer_size,4,
                          channel->sock_func_cb_data), iVar4 != 0)) &&
     (piVar5 = __errno_location(), *piVar5 != 0x26)) {
    return ARES_ECONNREFUSED;
  }
  if (((0 < channel->socket_receive_buffer_size) &&
      (iVar4 = (*(channel->sock_funcs).asetsockopt)
                         (fd,ARES_SOCKET_OPT_RECVBUF_SIZE,&channel->socket_receive_buffer_size,4,
                          channel->sock_func_cb_data), iVar4 != 0)) &&
     (piVar5 = __errno_location(), *piVar5 != 0x26)) {
    return ARES_ECONNREFUSED;
  }
  str = channel->local_dev_name;
  sVar6 = ares_strlen(str);
  if (sVar6 != 0) {
    p_Var2 = (channel->sock_funcs).asetsockopt;
    sVar6 = ares_strlen(str);
    (*p_Var2)(fd,ARES_SOCKET_OPT_BIND_DEVICE,str,(ares_socklen_t)sVar6,channel->sock_func_cb_data);
  }
  if (family == 10) {
    auVar8[0] = -(channel->local_ip6[0] == 0);
    auVar8[1] = -(channel->local_ip6[1] == 0);
    auVar8[2] = -(channel->local_ip6[2] == 0);
    auVar8[3] = -(channel->local_ip6[3] == 0);
    auVar8[4] = -(channel->local_ip6[4] == 0);
    auVar8[5] = -(channel->local_ip6[5] == 0);
    auVar8[6] = -(channel->local_ip6[6] == 0);
    auVar8[7] = -(channel->local_ip6[7] == 0);
    auVar8[8] = -(channel->local_ip6[8] == 0);
    auVar8[9] = -(channel->local_ip6[9] == 0);
    auVar8[10] = -(channel->local_ip6[10] == 0);
    auVar8[0xb] = -(channel->local_ip6[0xb] == 0);
    auVar8[0xc] = -(channel->local_ip6[0xc] == 0);
    auVar8[0xd] = -(channel->local_ip6[0xd] == 0);
    auVar8[0xe] = -(channel->local_ip6[0xe] == 0);
    auVar8[0xf] = -(channel->local_ip6[0xf] == 0);
    if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(auVar8[0xf] >> 7) << 0xf)
        == 0xffff) {
      return ARES_SUCCESS;
    }
    local_58.sa_data[2] = '\0';
    local_58.sa_data[3] = '\0';
    local_58.sa_data[4] = '\0';
    local_58.sa_data[5] = '\0';
    uStack_40 = 0;
    local_58.sa_family = 10;
    uStack_48 = *(undefined8 *)(channel->local_ip6 + 8);
    local_58.sa_data._6_4_ = SUB84(*(undefined8 *)channel->local_ip6,0);
    local_58.sa_data._10_4_ = SUB84((ulong)*(undefined8 *)channel->local_ip6 >> 0x20,0);
    sVar7 = 0x1c;
  }
  else {
    if (family != 2) {
      return ARES_SUCCESS;
    }
    uVar1 = channel->local_ip4;
    if (uVar1 == 0) {
      return ARES_SUCCESS;
    }
    local_58.sa_data[6] = '\0';
    local_58.sa_data[7] = '\0';
    local_58.sa_data[8] = '\0';
    local_58.sa_data[9] = '\0';
    local_58.sa_data[10] = '\0';
    local_58.sa_data[0xb] = '\0';
    local_58.sa_data[0xc] = '\0';
    local_58.sa_data[0xd] = '\0';
    local_58.sa_family = 2;
    local_58.sa_data._2_4_ =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    sVar7 = 0x10;
  }
  local_58.sa_data[0] = '\0';
  local_58.sa_data[1] = '\0';
  p_Var3 = (channel->sock_funcs).abind;
  if ((p_Var3 != (_func_int_ares_socket_t_uint_sockaddr_ptr_socklen_t_void_ptr *)0x0) &&
     (iVar4 = (*p_Var3)(fd,3 - (is_tcp == ARES_FALSE),&local_58,sVar7,channel->sock_func_cb_data),
     iVar4 != 0)) {
    return ARES_ECONNREFUSED;
  }
  return ARES_SUCCESS;
}

Assistant:

ares_status_t ares_socket_configure(ares_channel_t *channel, int family,
                                    ares_bool_t is_tcp, ares_socket_t fd)
{
  union {
    struct sockaddr     sa;
    struct sockaddr_in  sa4;
    struct sockaddr_in6 sa6;
  } local;

  ares_socklen_t bindlen = 0;
  int            rv;
  unsigned int   bind_flags = 0;

  /* Set the socket's send and receive buffer sizes. */
  if (channel->socket_send_buffer_size > 0) {
    rv = channel->sock_funcs.asetsockopt(
      fd, ARES_SOCKET_OPT_SENDBUF_SIZE,
      (void *)&channel->socket_send_buffer_size,
      sizeof(channel->socket_send_buffer_size), channel->sock_func_cb_data);
    if (rv != 0 && SOCKERRNO != ENOSYS) {
      return ARES_ECONNREFUSED; /* LCOV_EXCL_LINE: UntestablePath */
    }
  }

  if (channel->socket_receive_buffer_size > 0) {
    rv = channel->sock_funcs.asetsockopt(
      fd, ARES_SOCKET_OPT_RECVBUF_SIZE,
      (void *)&channel->socket_receive_buffer_size,
      sizeof(channel->socket_receive_buffer_size), channel->sock_func_cb_data);
    if (rv != 0 && SOCKERRNO != ENOSYS) {
      return ARES_ECONNREFUSED; /* LCOV_EXCL_LINE: UntestablePath */
    }
  }

  /* Bind to network interface if configured */
  if (ares_strlen(channel->local_dev_name)) {
    /* Prior versions silently ignored failure, so we need to maintain that
     * compatibility */
    (void)channel->sock_funcs.asetsockopt(
      fd, ARES_SOCKET_OPT_BIND_DEVICE, channel->local_dev_name,
      (ares_socklen_t)ares_strlen(channel->local_dev_name),
      channel->sock_func_cb_data);
  }

  /* Bind to ip address if configured */
  if (family == AF_INET && channel->local_ip4) {
    memset(&local.sa4, 0, sizeof(local.sa4));
    local.sa4.sin_family      = AF_INET;
    local.sa4.sin_addr.s_addr = htonl(channel->local_ip4);
    bindlen                   = sizeof(local.sa4);
  } else if (family == AF_INET6 &&
             memcmp(channel->local_ip6, ares_in6addr_any._S6_un._S6_u8,
                    sizeof(channel->local_ip6)) != 0) {
    /* Only if not link-local and an ip other than "::" is specified */
    memset(&local.sa6, 0, sizeof(local.sa6));
    local.sa6.sin6_family = AF_INET6;
    memcpy(&local.sa6.sin6_addr, channel->local_ip6,
           sizeof(channel->local_ip6));
    bindlen = sizeof(local.sa6);
  }


  if (bindlen && channel->sock_funcs.abind != NULL) {
    bind_flags |= ARES_SOCKET_BIND_CLIENT;
    if (is_tcp) {
      bind_flags |= ARES_SOCKET_BIND_TCP;
    }
    if (channel->sock_funcs.abind(fd, bind_flags, &local.sa, bindlen,
                                  channel->sock_func_cb_data) != 0) {
      return ARES_ECONNREFUSED;
    }
  }

  return ARES_SUCCESS;
}